

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QList<QStringView> * __thiscall
QStringView::split(QList<QStringView> *__return_storage_ptr__,QStringView *this,QStringView sep,
                  SplitBehavior behavior,CaseSensitivity cs)

{
  storage_type_conflict *psVar1;
  QStringView haystack0;
  qsizetype qVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = this->m_data;
  lVar4 = this->m_size;
  haystack0 = *this;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QStringView *)0x0;
  lVar5 = 0;
  uVar3 = 0;
  while( true ) {
    qVar2 = QtPrivate::findString(haystack0,uVar3 + lVar5,sep,cs);
    if (qVar2 == -1) break;
    if (qVar2 - lVar5 != 0 ||
        (QFlagsStorage<Qt::SplitBehaviorFlags>)
        behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
        super_QFlagsStorage<Qt::SplitBehaviorFlags>.i == (QFlagsStorage<Qt::SplitBehaviorFlags>)0x0)
    {
      local_48.m_data = psVar1 + lVar5;
      local_48.m_size = qVar2 - lVar5;
      QList<QStringView>::emplaceBack<QStringView>(__return_storage_ptr__,&local_48);
    }
    lVar5 = qVar2 + sep.m_size;
    uVar3 = (ulong)(sep.m_size == 0);
  }
  lVar4 = lVar4 - lVar5;
  if (lVar4 != 0 ||
      (QFlagsStorage<Qt::SplitBehaviorFlags>)
      behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i == (QFlagsStorage<Qt::SplitBehaviorFlags>)0x0) {
    local_48.m_data = psVar1 + lVar5;
    local_48.m_size = lVar4;
    QList<QStringView>::emplaceBack<QStringView>(__return_storage_ptr__,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QStringView> QStringView::split(QStringView sep, Qt::SplitBehavior behavior, Qt::CaseSensitivity cs) const
{
    return splitString<QList<QStringView>>(QStringView(*this), sep, behavior, cs);
}